

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::NaiveSwapHasBit
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  FieldOptions *this_00;
  LogMessage *pLVar4;
  Reflection *this_01;
  Reflection *this_02;
  uint32_t *puVar5;
  bool is_m2_hasbit_set;
  bool is_m1_hasbit_set;
  Reflection *r2;
  Reflection *r1;
  LogMessage local_40;
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message2_local;
  Message *message1_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message2;
  message2_local = message1;
  message1_local = (Message *)this;
  this_00 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(this_00);
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xc7f,"!field->options().weak()");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  bVar1 = internal::ReflectionSchema::HasHasbits(&this->schema_);
  if (bVar1) {
    this_01 = Message::GetReflection(message2_local);
    this_02 = Message::GetReflection((Message *)field_local);
    puVar5 = GetHasBits(this_01,message2_local);
    uVar3 = internal::ReflectionSchema::HasBitIndex(&this_01->schema_,local_28);
    bVar1 = anon_unknown_6::IsIndexInHasBitSet(puVar5,uVar3);
    puVar5 = GetHasBits(this_02,(Message *)field_local);
    uVar3 = internal::ReflectionSchema::HasBitIndex(&this_02->schema_,local_28);
    bVar2 = anon_unknown_6::IsIndexInHasBitSet(puVar5,uVar3);
    if (bVar1) {
      SetHasBit(this,(Message *)field_local,local_28);
    }
    else {
      ClearHasBit(this,(Message *)field_local,local_28);
    }
    if (bVar2) {
      SetHasBit(this,message2_local,local_28);
    }
    else {
      ClearHasBit(this,message2_local,local_28);
    }
  }
  return;
}

Assistant:

void Reflection::NaiveSwapHasBit(Message* message1, Message* message2,
                                 const FieldDescriptor* field) const {
  ABSL_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  const Reflection* r1 = message1->GetReflection();
  const Reflection* r2 = message2->GetReflection();

  bool is_m1_hasbit_set = IsIndexInHasBitSet(r1->GetHasBits(*message1),
                                             r1->schema_.HasBitIndex(field));
  bool is_m2_hasbit_set = IsIndexInHasBitSet(r2->GetHasBits(*message2),
                                             r2->schema_.HasBitIndex(field));

  if (is_m1_hasbit_set) {
    SetHasBit(message2, field);
  } else {
    ClearHasBit(message2, field);
  }

  if (is_m2_hasbit_set) {
    SetHasBit(message1, field);
  } else {
    ClearHasBit(message1, field);
  }
}